

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid>::MidSideNodeIndex
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid> *this,int side,int64_t *index)

{
  int iVar1;
  int64_t iVar2;
  long *plVar3;
  
  *index = -1;
  if (-1 < side) {
    iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0xf0))();
    if (side < iVar1) {
      iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x90))(this);
      if (side < iVar1) {
        iVar2 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0xa8))(this,side);
        *index = iVar2;
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZGeoElRefLess<TGeo>::MidSideNodeIndex. Bad parameter side = ",
             0x3e);
  plVar3 = (long *)std::ostream::operator<<(&std::cerr,side);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::MidSideNodeIndex(int side,int64_t &index) const{
	//TRef::MidSideNodeIndex(this,side,index);
	index = -1;
	if(side<0 || side>NSides()-1) {
		PZError << "TPZGeoElRefLess<TGeo>::MidSideNodeIndex. Bad parameter side = " << side << std::endl;
		return;
	}
	if(side<NNodes()) {//o n�medio do lado 0 �o 0 etc.
		index = NodeIndex(side);
		return;
	}
}